

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CoverCrossSyntax::CoverCrossSyntax
          (CoverCrossSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          NamedLabelSyntax *label,Token cross,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *items,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  bool bVar1;
  IdentifierNameSyntax *pIVar2;
  reference ppMVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_stack_00000008;
  MemberSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::MemberSyntax> *__range2_1;
  IdentifierNameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *in_stack_ffffffffffffff58;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *this_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffff90;
  
  this_01 = (span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)&child_1;
  this_00 = (SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)&stack0x00000010;
  MemberSyntax::MemberSyntax
            ((MemberSyntax *)in_stack_ffffffffffffff90._M_current,
             (SyntaxKind)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80);
  in_RDI[3].parent = in_RDX;
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff58);
  in_RDI[6].previewNode = in_stack_00000008;
  *(_func_int ***)(in_RDI + 7) = (this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[7].parent = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::MemberSyntax> *)this_00,
             (SyntaxList<slang::syntax::MemberSyntax> *)in_stack_ffffffffffffff58);
  *(MemberSyntax **)(in_RDI + 10) = (MemberSyntax *)this_01->_M_ptr;
  in_RDI[10].parent = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  in_RDI[10].previewNode = (SyntaxNode *)__begin2_1._M_current;
  *(SyntaxList<slang::syntax::MemberSyntax> **)(in_RDI + 0xb) = __range2_1;
  if (in_RDI[3].parent != (SyntaxNode *)0x0) {
    (in_RDI[3].parent)->parent = in_RDI;
  }
  *(SyntaxNode **)(in_RDI + 5) = in_RDI;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)0x74880c);
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::IdentifierNameSyntax_*> *)
                       in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pIVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                          *)0x74884b);
    (pIVar2->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::iterator_base<slang::syntax::IdentifierNameSyntax_*>,_false>
                *)this_00);
  }
  if (in_RDI[6].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[6].previewNode)->parent = in_RDI;
  }
  in_RDI[8].parent = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff58);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff90);
    ((*ppMVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff90);
  }
  return;
}

Assistant:

CoverCrossSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NamedLabelSyntax* label, Token cross, const SeparatedSyntaxList<IdentifierNameSyntax>& items, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::CoverCross, attributes), label(label), cross(cross), items(items), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        if (this->label) this->label->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }